

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quicly.c
# Opt level: O0

void do_free_pn_space(st_quicly_pn_space_t *space)

{
  void *in_RDI;
  
  quicly_ranges_clear((quicly_ranges_t *)0x14182e);
  free(in_RDI);
  return;
}

Assistant:

static void do_free_pn_space(struct st_quicly_pn_space_t *space)
{
    quicly_ranges_clear(&space->ack_queue);
    free(space);
}